

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O1

void __thiscall
Hospital::Update_Patient_File
          (Hospital *this,vector<Patient,_std::allocator<Patient>_> *All_Of_Patients,
          ofstream *inFile)

{
  ostream *poVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  ofstream abus;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  system("pause");
  std::ofstream::ofstream(&local_230);
  std::ofstream::open((char *)&local_230,0x12917b);
  if ((All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar2 = 0;
    do {
      lVar4 = 8;
      uVar3 = 0;
      while( true ) {
        Patient::patient_all_ino_getter_abi_cxx11_
                  (&local_248,
                   (All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
                   super__Vector_impl_data._M_start + uVar2);
        lVar5 = (long)local_248.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_248.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_248);
        if ((ulong)(lVar5 >> 5) <= uVar3) break;
        Patient::patient_all_ino_getter_abi_cxx11_
                  (&local_248,
                   (All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
                   super__Vector_impl_data._M_start + uVar2);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,
                            *(char **)((long)local_248.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar4 + -8)
                            ,*(long *)((long)&((local_248.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              _M_dataplus)._M_p + lVar4));
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_248);
        uVar3 = uVar3 + 1;
        lVar4 = lVar4 + 0x20;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
      uVar2 = uVar2 + 1;
      uVar3 = ((long)(All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 4) * -0x30c30c30c30c30c3;
    } while (uVar2 <= uVar3 && uVar3 - uVar2 != 0);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void Hospital:: Update_Patient_File ( vector<Patient>&All_Of_Patients , ofstream& inFile) {
    system("pause");
    //  cout << "hiiiii";
    ofstream abus;
    abus.open("Patients.txt");
    //abus <<"Asghar";

    for (int i = 0; i < All_Of_Patients.size(); i++) {
        for (int j = 0; j < All_Of_Patients[i].patient_all_ino_getter().size(); ++j) {
            abus << All_Of_Patients[i].patient_all_ino_getter()[j] << " ";
//            abus <<"Asghar";
        }
        abus << "\n";
    }
    //inFile.close();

}